

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O0

void __thiscall ViewTest::shapeAssignTest<false>(ViewTest *this)

{
  undefined1 *puVar1;
  allocator<int> *paVar2;
  allocator<unsigned_long> *paVar3;
  int iVar4;
  value_type vVar5;
  value_type vVar6;
  iterator iVar7;
  iterator iVar8;
  size_t sVar9;
  size_type sVar10;
  reference pvVar11;
  ulong uVar12;
  reference piVar13;
  size_t sVar14;
  bool local_1599;
  bool local_1529;
  bool local_14d1;
  bool local_13e9;
  bool local_1349;
  bool local_1291;
  bool local_1229;
  bool local_11d1;
  bool local_10e9;
  bool local_1029;
  bool local_fa9;
  bool local_f61;
  bool local_e79;
  bool local_df1;
  bool local_d99;
  bool local_d61;
  bool local_d21;
  ulong local_d20;
  size_t p_4;
  size_t k_9;
  size_t j_34;
  ulong local_d00;
  size_t j_33;
  unsigned_short j_32;
  iterator iStack_cf0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_ce8;
  allocator<int> local_cd9;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_cd8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_cd0;
  undefined1 local_cc8 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_17;
  undefined1 local_c80 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shapeBefore_1;
  undefined1 local_c60 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_9;
  ulong local_c40;
  size_t p_3;
  size_t k_8;
  size_t j_31;
  ulong local_c20;
  size_t j_30;
  unsigned_short j_29;
  iterator iStack_c10;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_c08;
  allocator<int> local_bf9;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_bf8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_bf0;
  undefined1 local_be8 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_16;
  undefined1 local_ba0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_8;
  ulong local_b80;
  size_t k_7;
  size_t j_28;
  ulong local_b68;
  size_t j_27;
  unsigned_short j_26;
  iterator iStack_b58;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_b50;
  allocator<int> local_b41;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_b40;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_b38;
  undefined1 local_b30 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_15;
  undefined1 local_ae8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape2D_4;
  undefined1 local_ac8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape3D_4;
  ulong local_aa8;
  size_t j_25;
  unsigned_short j_24;
  iterator iStack_a98;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_a90;
  allocator<int> local_a81;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_a80;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_a78;
  undefined1 local_a70 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_14;
  undefined1 local_a28 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape1D_3;
  undefined1 local_a08 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape3D_3;
  allocator<int> local_9d1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_9d0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_9c8;
  undefined1 local_9c0 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_13;
  undefined1 local_978 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape0_2;
  undefined1 local_958 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape3D_2;
  ulong local_938;
  size_t p_2;
  size_t k_6;
  size_t j_23;
  ulong local_918;
  size_t j_22;
  unsigned_short j_21;
  iterator iStack_908;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_900;
  allocator<int> local_8f1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_8f0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_8e8;
  undefined1 local_8e0 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_12;
  undefined1 local_898 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape3D_1;
  undefined1 local_878 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape2D_3;
  ulong local_858;
  size_t k_5;
  size_t j_20;
  unsigned_short j_19;
  iterator iStack_840;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_838;
  allocator<int> local_829;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_828;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_820;
  undefined1 local_818 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_11;
  undefined1 local_7d0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shapeBefore;
  undefined1 local_7b0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_7;
  ulong local_790;
  size_t k_4;
  size_t j_18;
  unsigned_short j_17;
  iterator iStack_778;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_770;
  allocator<int> local_761;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_760;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_758;
  undefined1 local_750 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_10;
  undefined1 local_708 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_6;
  ulong local_6e8;
  size_t j_16;
  unsigned_short j_15;
  iterator iStack_6d8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_6d0;
  allocator<int> local_6c1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_6c0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_6b8;
  undefined1 local_6b0 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_9;
  undefined1 local_668 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape1D_2;
  undefined1 local_648 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape2D_2;
  allocator<int> local_611;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_610;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_608;
  undefined1 local_600 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_8;
  undefined1 local_5b8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape0_1;
  undefined1 local_598 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape2D_1;
  ulong local_578;
  size_t p_1;
  size_t k_3;
  size_t j_14;
  ulong local_558;
  size_t j_13;
  unsigned_short j_12;
  iterator iStack_548;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_540;
  allocator<int> local_531;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_530;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_528;
  undefined1 local_520 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_7;
  undefined1 local_4d8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape3D;
  undefined1 local_4b8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape1D_1;
  ulong local_498;
  size_t k_2;
  size_t j_11;
  ulong local_480;
  size_t j_10;
  unsigned_short j_9;
  iterator iStack_470;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_468;
  allocator<int> local_459;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_458;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_450;
  undefined1 local_448 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_6;
  undefined1 local_400 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape2D;
  undefined1 local_3e0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape1D;
  ulong local_3c0;
  size_t j_8;
  unsigned_short j_7;
  iterator iStack_3b0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_3a8;
  allocator<int> local_399;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_398;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_390;
  undefined1 local_388 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_5;
  undefined1 local_340 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_5;
  allocator<int> local_309;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_308;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_300;
  undefined1 local_2f8 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_4;
  undefined1 local_2b0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape0;
  undefined1 local_290 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_4;
  ulong local_270;
  size_t p;
  size_t k_1;
  size_t j_6;
  ulong local_250;
  size_t j_5;
  unsigned_short j_4;
  iterator iStack_240;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_238;
  allocator<unsigned_long> local_229;
  undefined1 local_228 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_3;
  undefined1 local_208 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_3;
  ulong local_1c0;
  size_t k;
  size_t j_3;
  unsigned_short j_2;
  iterator iStack_1a8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1a0;
  allocator<unsigned_long> local_191;
  undefined1 local_190 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_2;
  undefined1 local_170 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_2;
  ulong local_128;
  size_t j_1;
  unsigned_short j;
  iterator iStack_118;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_110;
  allocator<unsigned_long> local_101;
  undefined1 local_100 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_1;
  undefined1 local_e0 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_1;
  allocator<unsigned_long> local_81;
  undefined1 local_80 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  allocator<int> local_51;
  undefined1 local_50 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v;
  ViewTest *this_local;
  
  v.geometry_._48_8_ = this;
  std::allocator<int>::allocator(&local_51);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_50,&this->scalar_,&local_51);
  std::allocator<int>::~allocator(&local_51);
  std::allocator<unsigned_long>::allocator(&local_81);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_80,0,&local_81);
  std::allocator<unsigned_long>::~allocator(&local_81);
  iVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_80);
  iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_80);
  puVar1 = &v_1.geometry_.field_0x37;
  std::allocator<int>::allocator((allocator<int> *)puVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_50,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar7._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar8._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)puVar1);
  std::allocator<int>::~allocator((allocator<int> *)&v_1.geometry_.field_0x37);
  sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_50);
  sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_80);
  local_d61 = false;
  if (sVar9 == sVar10) {
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_50);
    local_d61 = sVar9 == 1;
  }
  v_1.geometry_._54_1_ = local_d61;
  test((bool *)&v_1.geometry_.field_0x36);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_80);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_50);
  paVar2 = (allocator<int> *)
           ((long)&shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar2);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e0,&this->scalar_,paVar2);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<unsigned_long>::allocator(&local_101);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_100,1,&local_101);
  std::allocator<unsigned_long>::~allocator(&local_101);
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_100,0);
  *pvVar11 = 0x18;
  local_110._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_100);
  iStack_118 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_100);
  std::allocator<int>::allocator((allocator<int> *)((long)&j_1 + 7));
  andres::View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_e0,local_110,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iStack_118._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator<int> *)((long)&j_1 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&j_1 + 7));
  sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e0);
  sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_100);
  local_d99 = false;
  if (sVar9 == sVar10) {
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e0);
    local_d99 = sVar9 == 0x18;
  }
  j_1._6_1_ = local_d99;
  test((bool *)((long)&j_1 + 6));
  j_1._4_2_ = 0;
  while( true ) {
    uVar12 = (ulong)j_1._4_2_;
    sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_100);
    if (sVar10 <= uVar12) break;
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e0,(ulong)j_1._4_2_
                      );
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_100,
                         (ulong)j_1._4_2_);
    j_1._3_1_ = sVar9 == *pvVar11;
    test((bool *)((long)&j_1 + 3));
    j_1._4_2_ = j_1._4_2_ + 1;
  }
  local_128 = 0;
  while( true ) {
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e0);
    if (sVar9 <= local_128) break;
    piVar13 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e0,local_128);
    v_2.geometry_._55_1_ = *piVar13 == this->data_[local_128];
    test((bool *)&v_2.geometry_.field_0x37);
    local_128 = local_128 + 1;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_100);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e0);
  paVar2 = (allocator<int> *)
           ((long)&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar2);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_170,&this->scalar_,paVar2);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<unsigned_long>::allocator(&local_191);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_190,2,&local_191);
  std::allocator<unsigned_long>::~allocator(&local_191);
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_190,0);
  *pvVar11 = 6;
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_190,1);
  *pvVar11 = 4;
  local_1a0._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_190);
  iStack_1a8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_190);
  std::allocator<int>::allocator((allocator<int> *)((long)&j_3 + 7));
  andres::View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_170,local_1a0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iStack_1a8._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator<int> *)((long)&j_3 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&j_3 + 7));
  sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_170);
  sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_190);
  local_df1 = false;
  if (sVar9 == sVar10) {
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_170);
    local_df1 = sVar9 == 0x18;
  }
  j_3._6_1_ = local_df1;
  test((bool *)((long)&j_3 + 6));
  j_3._4_2_ = 0;
  while( true ) {
    uVar12 = (ulong)j_3._4_2_;
    sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_190);
    if (sVar10 <= uVar12) break;
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_170,
                       (ulong)j_3._4_2_);
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_190,
                         (ulong)j_3._4_2_);
    j_3._3_1_ = sVar9 == *pvVar11;
    test((bool *)((long)&j_3 + 3));
    j_3._4_2_ = j_3._4_2_ + 1;
  }
  k = 0;
  while( true ) {
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_170,0);
    if (sVar9 <= k) break;
    local_1c0 = 0;
    while( true ) {
      sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_170,1);
      if (sVar9 <= local_1c0) break;
      piVar13 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                          ((View<int,false,std::allocator<unsigned_long>> *)local_170,k,local_1c0);
      iVar4 = *piVar13;
      pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_190,0);
      v_3.geometry_._55_1_ = iVar4 == this->data_[k + local_1c0 * *pvVar11];
      test((bool *)&v_3.geometry_.field_0x37);
      local_1c0 = local_1c0 + 1;
    }
    k = k + 1;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_190);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_170);
  paVar2 = (allocator<int> *)
           ((long)&shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar2);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_208,&this->scalar_,paVar2);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<unsigned_long>::allocator(&local_229);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_228,3,&local_229);
  std::allocator<unsigned_long>::~allocator(&local_229);
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_228,0);
  *pvVar11 = 2;
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_228,1);
  *pvVar11 = 4;
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_228,2);
  *pvVar11 = 3;
  local_238._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_228);
  iStack_240 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_228);
  std::allocator<int>::allocator((allocator<int> *)((long)&j_5 + 7));
  andres::View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_208,local_238,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iStack_240._M_current,this->data2x_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator<int> *)((long)&j_5 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&j_5 + 7));
  sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_208);
  sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_228);
  local_e79 = false;
  if (sVar9 == sVar10) {
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_208);
    local_e79 = sVar9 == 0x18;
  }
  j_5._6_1_ = local_e79;
  test((bool *)((long)&j_5 + 6));
  j_5._4_2_ = 0;
  while( true ) {
    uVar12 = (ulong)j_5._4_2_;
    sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_228);
    if (sVar10 <= uVar12) break;
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_208,
                       (ulong)j_5._4_2_);
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_228,
                         (ulong)j_5._4_2_);
    j_5._3_1_ = sVar9 == *pvVar11;
    test((bool *)((long)&j_5 + 3));
    j_5._4_2_ = j_5._4_2_ + 1;
  }
  local_250 = 0;
  while( true ) {
    uVar12 = local_250;
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_208);
    if (sVar9 <= uVar12) break;
    piVar13 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_208,local_250);
    j_6._7_1_ = *piVar13 == this->data2x_[local_250];
    test((bool *)((long)&j_6 + 7));
    local_250 = local_250 + 1;
  }
  k_1 = 0;
  while( true ) {
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_208,0);
    if (sVar9 <= k_1) break;
    p = 0;
    while( true ) {
      sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_208,1);
      if (sVar9 <= p) break;
      local_270 = 0;
      while( true ) {
        sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_208,2);
        if (sVar9 <= local_270) break;
        piVar13 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)local_208,k_1,p,
                             local_270);
        iVar4 = *piVar13;
        pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_228,0);
        vVar5 = *pvVar11;
        pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_228,0);
        vVar6 = *pvVar11;
        pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_228,1);
        shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ =
             iVar4 == this->data2x_[k_1 + p * vVar5 + local_270 * vVar6 * *pvVar11];
        test((bool *)((long)&shape_4.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        local_270 = local_270 + 1;
      }
      p = p + 1;
    }
    k_1 = k_1 + 1;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_228);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_208);
  paVar3 = (allocator<unsigned_long> *)
           ((long)&shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_long>::allocator(paVar3);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_290,1,paVar3);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             ((long)&shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  puVar1 = &v_4.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2b0,0,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_4.geometry_.field_0x37);
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_290,0);
  *pvVar11 = 0x18;
  local_300._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_290);
  local_308._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_290);
  std::allocator<int>::allocator(&local_309);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_2f8,local_300,local_308,
             this->data_,&andres::defaultOrder,&andres::defaultOrder,&local_309);
  std::allocator<int>::~allocator(&local_309);
  iVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2b0);
  iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2b0);
  paVar2 = (allocator<int> *)
           ((long)&shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar2);
  andres::View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_2f8,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar7._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar8._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar2);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_2f8);
  sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2b0);
  local_f61 = false;
  if (sVar9 == sVar10) {
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_2f8);
    local_f61 = sVar9 == 1;
  }
  shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = local_f61;
  test((bool *)((long)&shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_2f8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2b0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_290);
  puVar1 = &v_5.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_340,1,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_5.geometry_.field_0x37);
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_340,0);
  *pvVar11 = 0x18;
  local_390._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_340);
  local_398._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_340);
  std::allocator<int>::allocator(&local_399);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_388,local_390,local_398,
             this->data_,&andres::defaultOrder,&andres::defaultOrder,&local_399);
  std::allocator<int>::~allocator(&local_399);
  local_3a8._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_340);
  iStack_3b0 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_340);
  std::allocator<int>::allocator((allocator<int> *)((long)&j_8 + 7));
  andres::View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_388,local_3a8,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iStack_3b0._M_current,this->data2x_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator<int> *)((long)&j_8 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&j_8 + 7));
  sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_388);
  sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_340);
  local_fa9 = false;
  if (sVar9 == sVar10) {
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_388);
    local_fa9 = sVar9 == 0x18;
  }
  j_8._6_1_ = local_fa9;
  test((bool *)((long)&j_8 + 6));
  j_8._4_2_ = 0;
  while( true ) {
    uVar12 = (ulong)j_8._4_2_;
    sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_340);
    if (sVar10 <= uVar12) break;
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_388,
                       (ulong)j_8._4_2_);
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_340,
                         (ulong)j_8._4_2_);
    j_8._3_1_ = sVar9 == *pvVar11;
    test((bool *)((long)&j_8 + 3));
    j_8._4_2_ = j_8._4_2_ + 1;
  }
  local_3c0 = 0;
  while( true ) {
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_388);
    if (sVar9 <= local_3c0) break;
    piVar13 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_388,local_3c0);
    shape1D.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar13 == this->data2x_[local_3c0];
    test((bool *)((long)&shape1D.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_3c0 = local_3c0 + 1;
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_388);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_340);
  paVar3 = (allocator<unsigned_long> *)
           ((long)&shape2D.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_long>::allocator(paVar3);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3e0,1,paVar3);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             ((long)&shape2D.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  puVar1 = &v_6.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_400,2,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_6.geometry_.field_0x37);
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3e0,0);
  *pvVar11 = 0x18;
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_400,0);
  *pvVar11 = 6;
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_400,1);
  *pvVar11 = 4;
  local_450._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3e0);
  local_458._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3e0);
  std::allocator<int>::allocator(&local_459);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_448,local_450,local_458,
             this->data_,&andres::defaultOrder,&andres::defaultOrder,&local_459);
  std::allocator<int>::~allocator(&local_459);
  local_468._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_400);
  iStack_470 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_400);
  std::allocator<int>::allocator((allocator<int> *)((long)&j_10 + 7));
  andres::View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_448,local_468,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iStack_470._M_current,this->data2x_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator<int> *)((long)&j_10 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&j_10 + 7));
  sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_448);
  sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_400);
  local_1029 = false;
  if (sVar9 == sVar10) {
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_448);
    local_1029 = sVar9 == 0x18;
  }
  j_10._6_1_ = local_1029;
  test((bool *)((long)&j_10 + 6));
  j_10._4_2_ = 0;
  while( true ) {
    uVar12 = (ulong)j_10._4_2_;
    sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_400);
    if (sVar10 <= uVar12) break;
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_448,
                       (ulong)j_10._4_2_);
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_400,
                         (ulong)j_10._4_2_);
    j_10._3_1_ = sVar9 == *pvVar11;
    test((bool *)((long)&j_10 + 3));
    j_10._4_2_ = j_10._4_2_ + 1;
  }
  local_480 = 0;
  while( true ) {
    uVar12 = local_480;
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_448);
    if (sVar9 <= uVar12) break;
    piVar13 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_448,local_480);
    j_11._7_1_ = *piVar13 == this->data2x_[local_480];
    test((bool *)((long)&j_11 + 7));
    local_480 = local_480 + 1;
  }
  k_2 = 0;
  while( true ) {
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_448,0);
    if (sVar9 <= k_2) break;
    local_498 = 0;
    while( true ) {
      sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_448,1);
      if (sVar9 <= local_498) break;
      piVar13 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                          ((View<int,false,std::allocator<unsigned_long>> *)local_448,k_2,local_498)
      ;
      iVar4 = *piVar13;
      pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_400,0);
      shape1D_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ =
           iVar4 == this->data2x_[k_2 + local_498 * *pvVar11];
      test((bool *)((long)&shape1D_1.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 7));
      local_498 = local_498 + 1;
    }
    k_2 = k_2 + 1;
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_448);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_400);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3e0);
  paVar3 = (allocator<unsigned_long> *)
           ((long)&shape3D.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_long>::allocator(paVar3);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4b8,1,paVar3);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             ((long)&shape3D.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  puVar1 = &v_7.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4d8,3,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_7.geometry_.field_0x37);
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4b8,0);
  *pvVar11 = 0x18;
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4d8,0);
  *pvVar11 = 2;
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4d8,1);
  *pvVar11 = 4;
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4d8,2);
  *pvVar11 = 3;
  local_528._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4b8);
  local_530._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4b8);
  std::allocator<int>::allocator(&local_531);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_520,local_528,local_530,
             this->data_,&andres::defaultOrder,&andres::defaultOrder,&local_531);
  std::allocator<int>::~allocator(&local_531);
  local_540._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4d8);
  iStack_548 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4d8);
  std::allocator<int>::allocator((allocator<int> *)((long)&j_13 + 7));
  andres::View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_520,local_540,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iStack_548._M_current,this->data2x_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator<int> *)((long)&j_13 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&j_13 + 7));
  sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_520);
  sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4d8);
  local_10e9 = false;
  if (sVar9 == sVar10) {
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_520);
    local_10e9 = sVar9 == 0x18;
  }
  j_13._6_1_ = local_10e9;
  test((bool *)((long)&j_13 + 6));
  j_13._4_2_ = 0;
  while( true ) {
    uVar12 = (ulong)j_13._4_2_;
    sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4d8);
    if (sVar10 <= uVar12) break;
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_520,
                       (ulong)j_13._4_2_);
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4d8,
                         (ulong)j_13._4_2_);
    j_13._3_1_ = sVar9 == *pvVar11;
    test((bool *)((long)&j_13 + 3));
    j_13._4_2_ = j_13._4_2_ + 1;
  }
  local_558 = 0;
  while( true ) {
    uVar12 = local_558;
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_520);
    if (sVar9 <= uVar12) break;
    piVar13 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_520,local_558);
    j_14._7_1_ = *piVar13 == this->data2x_[local_558];
    test((bool *)((long)&j_14 + 7));
    local_558 = local_558 + 1;
  }
  k_3 = 0;
  while( true ) {
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_520,0);
    if (sVar9 <= k_3) break;
    p_1 = 0;
    while( true ) {
      sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_520,1);
      if (sVar9 <= p_1) break;
      local_578 = 0;
      while( true ) {
        sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_520,2);
        if (sVar9 <= local_578) break;
        piVar13 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)local_520,k_3,p_1,
                             local_578);
        iVar4 = *piVar13;
        pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4d8,0);
        vVar5 = *pvVar11;
        pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4d8,0);
        vVar6 = *pvVar11;
        pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4d8,1);
        shape2D_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ =
             iVar4 == this->data2x_[k_3 + p_1 * vVar5 + local_578 * vVar6 * *pvVar11];
        test((bool *)((long)&shape2D_1.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        local_578 = local_578 + 1;
      }
      p_1 = p_1 + 1;
    }
    k_3 = k_3 + 1;
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_520);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4d8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4b8);
  paVar3 = (allocator<unsigned_long> *)
           ((long)&shape0_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_long>::allocator(paVar3);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_598,2,paVar3);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             ((long)&shape0_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  puVar1 = &v_8.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_5b8,0,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_8.geometry_.field_0x37);
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_598,0);
  *pvVar11 = 6;
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_598,1);
  *pvVar11 = 4;
  local_608._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_598);
  local_610._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_598);
  std::allocator<int>::allocator(&local_611);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_600,local_608,local_610,
             this->data_,&andres::defaultOrder,&andres::defaultOrder,&local_611);
  std::allocator<int>::~allocator(&local_611);
  iVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_5b8);
  iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_5b8);
  paVar2 = (allocator<int> *)
           ((long)&shape2D_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar2);
  andres::View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_600,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar7._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar8._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar2);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&shape2D_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_600);
  sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_5b8);
  local_11d1 = false;
  if (sVar9 == sVar10) {
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_600);
    local_11d1 = sVar9 == 1;
  }
  shape2D_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = local_11d1;
  test((bool *)((long)&shape2D_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_600);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_5b8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_598);
  paVar3 = (allocator<unsigned_long> *)
           ((long)&shape1D_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_long>::allocator(paVar3);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_648,2,paVar3);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             ((long)&shape1D_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  puVar1 = &v_9.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_668,1,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_9.geometry_.field_0x37);
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_648,0);
  *pvVar11 = 6;
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_648,1);
  *pvVar11 = 4;
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_668,0);
  *pvVar11 = 0x18;
  local_6b8._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_648);
  local_6c0._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_648);
  std::allocator<int>::allocator(&local_6c1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_6b0,local_6b8,local_6c0,
             this->data_,&andres::defaultOrder,&andres::defaultOrder,&local_6c1);
  std::allocator<int>::~allocator(&local_6c1);
  local_6d0._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_668);
  iStack_6d8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_668);
  std::allocator<int>::allocator((allocator<int> *)((long)&j_16 + 7));
  andres::View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_6b0,local_6d0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iStack_6d8._M_current,this->data2x_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator<int> *)((long)&j_16 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&j_16 + 7));
  sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_6b0);
  sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_668);
  local_1229 = false;
  if (sVar9 == sVar10) {
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_6b0);
    local_1229 = sVar9 == 0x18;
  }
  j_16._6_1_ = local_1229;
  test((bool *)((long)&j_16 + 6));
  j_16._4_2_ = 0;
  while( true ) {
    uVar12 = (ulong)j_16._4_2_;
    sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_668);
    if (sVar10 <= uVar12) break;
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_6b0,
                       (ulong)j_16._4_2_);
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_668,
                         (ulong)j_16._4_2_);
    j_16._3_1_ = sVar9 == *pvVar11;
    test((bool *)((long)&j_16 + 3));
    j_16._4_2_ = j_16._4_2_ + 1;
  }
  local_6e8 = 0;
  while( true ) {
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_6b0);
    if (sVar9 <= local_6e8) break;
    piVar13 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_6b0,local_6e8);
    shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar13 == this->data2x_[local_6e8];
    test((bool *)((long)&shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_6e8 = local_6e8 + 1;
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_6b0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_668);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_648);
  puVar1 = &v_10.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_708,2,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_10.geometry_.field_0x37);
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_708,0);
  *pvVar11 = 6;
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_708,1);
  *pvVar11 = 4;
  local_758._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_708);
  local_760._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_708);
  std::allocator<int>::allocator(&local_761);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_750,local_758,local_760,
             this->data_,&andres::defaultOrder,&andres::defaultOrder,&local_761);
  std::allocator<int>::~allocator(&local_761);
  local_770._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_708);
  iStack_778 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_708);
  std::allocator<int>::allocator((allocator<int> *)((long)&j_18 + 7));
  andres::View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_750,local_770,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iStack_778._M_current,this->data2x_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator<int> *)((long)&j_18 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&j_18 + 7));
  sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_750);
  sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_708);
  local_1291 = false;
  if (sVar9 == sVar10) {
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_750);
    local_1291 = sVar9 == 0x18;
  }
  j_18._6_1_ = local_1291;
  test((bool *)((long)&j_18 + 6));
  j_18._4_2_ = 0;
  while( true ) {
    uVar12 = (ulong)j_18._4_2_;
    sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_708);
    if (sVar10 <= uVar12) break;
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_750,
                       (ulong)j_18._4_2_);
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_708,
                         (ulong)j_18._4_2_);
    j_18._3_1_ = sVar9 == *pvVar11;
    test((bool *)((long)&j_18 + 3));
    j_18._4_2_ = j_18._4_2_ + 1;
  }
  k_4 = 0;
  while( true ) {
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_750,0);
    if (sVar9 <= k_4) break;
    local_790 = 0;
    while( true ) {
      sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_750,1);
      if (sVar9 <= local_790) break;
      piVar13 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                          ((View<int,false,std::allocator<unsigned_long>> *)local_750,k_4,local_790)
      ;
      iVar4 = *piVar13;
      pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_708,0);
      shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ =
           iVar4 == this->data2x_[k_4 + local_790 * *pvVar11];
      test((bool *)((long)&shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      local_790 = local_790 + 1;
    }
    k_4 = k_4 + 1;
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_750);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_708);
  paVar3 = (allocator<unsigned_long> *)
           ((long)&shapeBefore.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_long>::allocator(paVar3);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7b0,2,paVar3);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             ((long)&shapeBefore.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  puVar1 = &v_11.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7d0,2,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_11.geometry_.field_0x37);
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7d0,0);
  *pvVar11 = 4;
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7d0,1);
  *pvVar11 = 6;
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7b0,0);
  *pvVar11 = 6;
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7b0,1);
  *pvVar11 = 4;
  local_820._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7d0);
  local_828._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7d0);
  std::allocator<int>::allocator(&local_829);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_818,local_820,local_828,
             this->data_,&andres::defaultOrder,&andres::defaultOrder,&local_829);
  std::allocator<int>::~allocator(&local_829);
  local_838._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7b0);
  iStack_840 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7b0);
  std::allocator<int>::allocator((allocator<int> *)((long)&j_20 + 7));
  andres::View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_818,local_838,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iStack_840._M_current,this->data2x_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator<int> *)((long)&j_20 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&j_20 + 7));
  sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_818);
  sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7b0);
  local_1349 = false;
  if (sVar9 == sVar10) {
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_818);
    local_1349 = sVar9 == 0x18;
  }
  j_20._6_1_ = local_1349;
  test((bool *)((long)&j_20 + 6));
  j_20._4_2_ = 0;
  while( true ) {
    uVar12 = (ulong)j_20._4_2_;
    sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7b0);
    if (sVar10 <= uVar12) break;
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_818,
                       (ulong)j_20._4_2_);
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7b0,
                         (ulong)j_20._4_2_);
    j_20._3_1_ = sVar9 == *pvVar11;
    test((bool *)((long)&j_20 + 3));
    j_20._4_2_ = j_20._4_2_ + 1;
  }
  k_5 = 0;
  while( true ) {
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_818,0);
    if (sVar9 <= k_5) break;
    local_858 = 0;
    while( true ) {
      sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_818,1);
      if (sVar9 <= local_858) break;
      piVar13 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                          ((View<int,false,std::allocator<unsigned_long>> *)local_818,k_5,local_858)
      ;
      iVar4 = *piVar13;
      pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7b0,0);
      shape2D_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ =
           iVar4 == this->data2x_[k_5 + local_858 * *pvVar11];
      test((bool *)((long)&shape2D_3.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 7));
      local_858 = local_858 + 1;
    }
    k_5 = k_5 + 1;
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_818);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7d0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7b0);
  paVar3 = (allocator<unsigned_long> *)
           ((long)&shape3D_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_long>::allocator(paVar3);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_878,2,paVar3);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             ((long)&shape3D_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  puVar1 = &v_12.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_898,3,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_12.geometry_.field_0x37);
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_878,0);
  *pvVar11 = 6;
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_878,1);
  *pvVar11 = 4;
  local_8e8._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_878);
  local_8f0._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_878);
  std::allocator<int>::allocator(&local_8f1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_8e0,local_8e8,local_8f0,
             this->data_,&andres::defaultOrder,&andres::defaultOrder,&local_8f1);
  std::allocator<int>::~allocator(&local_8f1);
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_898,0);
  *pvVar11 = 2;
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_898,1);
  *pvVar11 = 4;
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_898,2);
  *pvVar11 = 3;
  local_900._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_898);
  iStack_908 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_898);
  std::allocator<int>::allocator((allocator<int> *)((long)&j_22 + 7));
  andres::View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_8e0,local_900,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iStack_908._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator<int> *)((long)&j_22 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&j_22 + 7));
  sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_8e0);
  sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_898);
  local_13e9 = false;
  if (sVar9 == sVar10) {
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_8e0);
    local_13e9 = sVar9 == 0x18;
  }
  j_22._6_1_ = local_13e9;
  test((bool *)((long)&j_22 + 6));
  j_22._4_2_ = 0;
  while( true ) {
    uVar12 = (ulong)j_22._4_2_;
    sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_898);
    if (sVar10 <= uVar12) break;
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_8e0,
                       (ulong)j_22._4_2_);
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_898,
                         (ulong)j_22._4_2_);
    j_22._3_1_ = sVar9 == *pvVar11;
    test((bool *)((long)&j_22 + 3));
    j_22._4_2_ = j_22._4_2_ + 1;
  }
  local_918 = 0;
  while( true ) {
    uVar12 = local_918;
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_8e0);
    if (sVar9 <= uVar12) break;
    piVar13 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_8e0,local_918);
    j_23._7_1_ = *piVar13 == this->data_[local_918];
    test((bool *)((long)&j_23 + 7));
    local_918 = local_918 + 1;
  }
  k_6 = 0;
  while( true ) {
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_8e0,0);
    if (sVar9 <= k_6) break;
    p_2 = 0;
    while( true ) {
      sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_8e0,1);
      if (sVar9 <= p_2) break;
      local_938 = 0;
      while( true ) {
        sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_8e0,2);
        if (sVar9 <= local_938) break;
        piVar13 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)local_8e0,k_6,p_2,
                             local_938);
        iVar4 = *piVar13;
        pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_898,0);
        vVar5 = *pvVar11;
        pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_898,0);
        vVar6 = *pvVar11;
        pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_898,1);
        shape3D_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ =
             iVar4 == this->data_[k_6 + p_2 * vVar5 + local_938 * vVar6 * *pvVar11];
        test((bool *)((long)&shape3D_2.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        local_938 = local_938 + 1;
      }
      p_2 = p_2 + 1;
    }
    k_6 = k_6 + 1;
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_8e0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_898);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_878);
  paVar3 = (allocator<unsigned_long> *)
           ((long)&shape0_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_long>::allocator(paVar3);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_958,3,paVar3);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             ((long)&shape0_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  puVar1 = &v_13.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_978,0,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_13.geometry_.field_0x37);
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_958,0);
  *pvVar11 = 3;
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_958,1);
  *pvVar11 = 4;
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_958,2);
  *pvVar11 = 2;
  local_9c8._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_958);
  local_9d0._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_958);
  std::allocator<int>::allocator(&local_9d1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_9c0,local_9c8,local_9d0,
             this->data_,&andres::defaultOrder,&andres::defaultOrder,&local_9d1);
  std::allocator<int>::~allocator(&local_9d1);
  iVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_978);
  iVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_978);
  paVar2 = (allocator<int> *)
           ((long)&shape3D_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar2);
  andres::View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_9c0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar7._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar8._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar2);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&shape3D_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_9c0);
  sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_978);
  local_14d1 = false;
  if (sVar9 == sVar10) {
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_9c0);
    local_14d1 = sVar9 == 1;
  }
  shape3D_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = local_14d1;
  test((bool *)((long)&shape3D_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_9c0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_978);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_958);
  paVar3 = (allocator<unsigned_long> *)
           ((long)&shape1D_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_long>::allocator(paVar3);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a08,3,paVar3);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             ((long)&shape1D_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  puVar1 = &v_14.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a28,1,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_14.geometry_.field_0x37);
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a08,0);
  *pvVar11 = 3;
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a08,1);
  *pvVar11 = 4;
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a08,2);
  *pvVar11 = 2;
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a28,0);
  *pvVar11 = 0x18;
  local_a78._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a08);
  local_a80._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a08);
  std::allocator<int>::allocator(&local_a81);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_a70,local_a78,local_a80,
             this->data_,&andres::defaultOrder,&andres::defaultOrder,&local_a81);
  std::allocator<int>::~allocator(&local_a81);
  local_a90._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a28);
  iStack_a98 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a28);
  std::allocator<int>::allocator((allocator<int> *)((long)&j_25 + 7));
  andres::View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_a70,local_a90,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iStack_a98._M_current,this->data2x_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator<int> *)((long)&j_25 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&j_25 + 7));
  sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a70);
  sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a28);
  local_1529 = false;
  if (sVar9 == sVar10) {
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a70);
    local_1529 = sVar9 == 0x18;
  }
  j_25._6_1_ = local_1529;
  test((bool *)((long)&j_25 + 6));
  j_25._4_2_ = 0;
  while( true ) {
    uVar12 = (ulong)j_25._4_2_;
    sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a28);
    if (sVar10 <= uVar12) break;
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a70,
                       (ulong)j_25._4_2_);
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a28,
                         (ulong)j_25._4_2_);
    j_25._3_1_ = sVar9 == *pvVar11;
    test((bool *)((long)&j_25 + 3));
    j_25._4_2_ = j_25._4_2_ + 1;
  }
  local_aa8 = 0;
  while( true ) {
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a70);
    if (sVar9 <= local_aa8) break;
    piVar13 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a70,local_aa8);
    shape3D_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar13 == this->data2x_[local_aa8];
    test((bool *)((long)&shape3D_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_aa8 = local_aa8 + 1;
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_a70);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a28);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a08);
  paVar3 = (allocator<unsigned_long> *)
           ((long)&shape2D_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_long>::allocator(paVar3);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ac8,3,paVar3);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             ((long)&shape2D_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  puVar1 = &v_15.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ae8,2,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_15.geometry_.field_0x37);
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ac8,0);
  *pvVar11 = 2;
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ac8,1);
  *pvVar11 = 4;
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ac8,2);
  *pvVar11 = 3;
  local_b38._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ac8);
  local_b40._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ac8);
  std::allocator<int>::allocator(&local_b41);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_b30,local_b38,local_b40,
             this->data_,&andres::defaultOrder,&andres::defaultOrder,&local_b41);
  std::allocator<int>::~allocator(&local_b41);
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ae8,0);
  *pvVar11 = 6;
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ae8,1);
  *pvVar11 = 4;
  local_b50._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ae8);
  iStack_b58 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ae8);
  std::allocator<int>::allocator((allocator<int> *)((long)&j_27 + 7));
  andres::View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_b30,local_b50,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iStack_b58._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator<int> *)((long)&j_27 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&j_27 + 7));
  sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b30);
  sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ae8);
  local_1599 = false;
  if (sVar9 == sVar10) {
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b30);
    local_1599 = sVar9 == 0x18;
  }
  j_27._6_1_ = local_1599;
  test((bool *)((long)&j_27 + 6));
  j_27._4_2_ = 0;
  while( true ) {
    uVar12 = (ulong)j_27._4_2_;
    sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ae8);
    if (sVar10 <= uVar12) break;
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b30,
                       (ulong)j_27._4_2_);
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ae8,
                         (ulong)j_27._4_2_);
    j_27._3_1_ = sVar9 == *pvVar11;
    test((bool *)((long)&j_27 + 3));
    j_27._4_2_ = j_27._4_2_ + 1;
  }
  local_b68 = 0;
  while( true ) {
    uVar12 = local_b68;
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b30);
    if (sVar9 <= uVar12) break;
    piVar13 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b30,local_b68);
    j_28._7_1_ = *piVar13 == this->data_[local_b68];
    test((bool *)((long)&j_28 + 7));
    local_b68 = local_b68 + 1;
  }
  k_7 = 0;
  while( true ) {
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b30,0);
    if (sVar9 <= k_7) break;
    local_b80 = 0;
    while( true ) {
      sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b30,1);
      if (sVar9 <= local_b80) break;
      piVar13 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                          ((View<int,false,std::allocator<unsigned_long>> *)local_b30,k_7,local_b80)
      ;
      iVar4 = *piVar13;
      pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ae8,0);
      shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ =
           iVar4 == this->data_[k_7 + local_b80 * *pvVar11];
      test((bool *)((long)&shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      local_b80 = local_b80 + 1;
    }
    k_7 = k_7 + 1;
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b30);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ae8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ac8);
  puVar1 = &v_16.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ba0,3,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_16.geometry_.field_0x37);
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ba0,0);
  *pvVar11 = 2;
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ba0,1);
  *pvVar11 = 4;
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ba0,2);
  *pvVar11 = 3;
  local_bf0._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ba0);
  local_bf8._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ba0);
  std::allocator<int>::allocator(&local_bf9);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_be8,local_bf0,local_bf8,
             this->data_,&andres::defaultOrder,&andres::defaultOrder,&local_bf9);
  std::allocator<int>::~allocator(&local_bf9);
  local_c08._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ba0);
  iStack_c10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ba0);
  std::allocator<int>::allocator((allocator<int> *)((long)&j_30 + 7));
  andres::View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_be8,local_c08,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iStack_c10._M_current,this->data2x_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator<int> *)((long)&j_30 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&j_30 + 7));
  j_30._4_2_ = 0;
  while( true ) {
    uVar12 = (ulong)j_30._4_2_;
    sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ba0);
    if (sVar10 <= uVar12) break;
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_be8,
                       (ulong)j_30._4_2_);
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ba0,
                         (ulong)j_30._4_2_);
    j_30._3_1_ = sVar9 == *pvVar11;
    test((bool *)((long)&j_30 + 3));
    j_30._4_2_ = j_30._4_2_ + 1;
  }
  local_c20 = 0;
  while( true ) {
    uVar12 = local_c20;
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_be8);
    if (sVar9 <= uVar12) break;
    piVar13 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_be8,local_c20);
    j_31._7_1_ = *piVar13 == this->data2x_[local_c20];
    test((bool *)((long)&j_31 + 7));
    local_c20 = local_c20 + 1;
  }
  k_8 = 0;
  while( true ) {
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_be8,0);
    if (sVar9 <= k_8) break;
    p_3 = 0;
    while( true ) {
      sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_be8,1);
      if (sVar9 <= p_3) break;
      local_c40 = 0;
      while( true ) {
        sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_be8,2);
        if (sVar9 <= local_c40) break;
        piVar13 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)local_be8,k_8,p_3,
                             local_c40);
        iVar4 = *piVar13;
        pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ba0,0);
        vVar5 = *pvVar11;
        pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ba0,0);
        vVar6 = *pvVar11;
        pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ba0,1);
        shape_9.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ =
             iVar4 == this->data2x_[k_8 + p_3 * vVar5 + local_c40 * vVar6 * *pvVar11];
        test((bool *)((long)&shape_9.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        local_c40 = local_c40 + 1;
      }
      p_3 = p_3 + 1;
    }
    k_8 = k_8 + 1;
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_be8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ba0);
  paVar3 = (allocator<unsigned_long> *)
           ((long)&shapeBefore_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_long>::allocator(paVar3);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c60,3,paVar3);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             ((long)&shapeBefore_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  puVar1 = &v_17.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c80,3,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_17.geometry_.field_0x37);
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c80,0);
  *pvVar11 = 3;
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c80,1);
  *pvVar11 = 2;
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c80,2);
  *pvVar11 = 4;
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c60,0);
  *pvVar11 = 2;
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c60,1);
  *pvVar11 = 4;
  pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c60,2);
  *pvVar11 = 3;
  local_cd0._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c80);
  local_cd8._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c80);
  std::allocator<int>::allocator(&local_cd9);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_cc8,local_cd0,local_cd8,
             this->data_,&andres::defaultOrder,&andres::defaultOrder,&local_cd9);
  std::allocator<int>::~allocator(&local_cd9);
  local_ce8._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c60);
  iStack_cf0 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c60);
  std::allocator<int>::allocator((allocator<int> *)((long)&j_33 + 7));
  andres::View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_cc8,local_ce8,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iStack_cf0._M_current,this->data2x_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator<int> *)((long)&j_33 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&j_33 + 7));
  j_33._4_2_ = 0;
  while( true ) {
    uVar12 = (ulong)j_33._4_2_;
    sVar10 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c60);
    if (sVar10 <= uVar12) break;
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_cc8,
                       (ulong)j_33._4_2_);
    pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c60,
                         (ulong)j_33._4_2_);
    j_33._3_1_ = sVar9 == *pvVar11;
    test((bool *)((long)&j_33 + 3));
    j_33._4_2_ = j_33._4_2_ + 1;
  }
  local_d00 = 0;
  while( true ) {
    uVar12 = local_d00;
    sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_cc8);
    if (sVar9 <= uVar12) break;
    piVar13 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_cc8,local_d00);
    j_34._7_1_ = *piVar13 == this->data2x_[local_d00];
    test((bool *)((long)&j_34 + 7));
    local_d00 = local_d00 + 1;
  }
  k_9 = 0;
  while( true ) {
    sVar9 = k_9;
    sVar14 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                       ((View<int,_false,_std::allocator<unsigned_long>_> *)local_cc8,0);
    if (sVar14 <= sVar9) break;
    p_4 = 0;
    while( true ) {
      sVar9 = p_4;
      sVar14 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                         ((View<int,_false,_std::allocator<unsigned_long>_> *)local_cc8,1);
      if (sVar14 <= sVar9) break;
      local_d20 = 0;
      while( true ) {
        uVar12 = local_d20;
        sVar9 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_cc8,2);
        if (sVar9 <= uVar12) break;
        piVar13 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                            ((View<int,false,std::allocator<unsigned_long>> *)local_cc8,k_9,p_4,
                             local_d20);
        sVar14 = k_9;
        sVar9 = p_4;
        iVar4 = *piVar13;
        pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c60,0);
        uVar12 = local_d20;
        vVar5 = *pvVar11;
        pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c60,0);
        vVar6 = *pvVar11;
        pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c60,1);
        local_d21 = iVar4 == this->data2x_[sVar14 + sVar9 * vVar5 + uVar12 * vVar6 * *pvVar11];
        test(&local_d21);
        local_d20 = local_d20 + 1;
      }
      p_4 = p_4 + 1;
    }
    k_9 = k_9 + 1;
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_cc8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c80);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c60);
  return;
}

Assistant:

void ViewTest::shapeAssignTest() {
    // scalar... 
    {
        // to scalar
        {
            andres::View<int, constTarget> v(&scalar_);
            std::vector<std::size_t> shape(0);
            v.assign(shape.begin(), shape.end(), data_);

            test(v.dimension() == shape.size() &&
                   v.size() == 1
            );
        }
        // to 1D
        {
            andres::View<int, constTarget> v(&scalar_);
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            v.assign(shape.begin(), shape.end(), data_);

            test(v.dimension() == shape.size() &&
                   v.size() == 24
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(v.shape(j) == shape[j]);
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == data_[j]);
            }
        }
        // to 2D
        {
            andres::View<int, constTarget> v(&scalar_);
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4;
            v.assign(shape.begin(), shape.end(), data_);

            test(v.dimension() == shape.size() &&
                   v.size() == 24
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(v.shape(j) == shape[j]);
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    test(v(j, k) == data_[j+k*shape[0]]);
                }
            }
        }
        // to 3D
        {
            andres::View<int, constTarget> v(&scalar_);
            std::vector<std::size_t> shape(3);
            shape[0] = 2;
            shape[1] = 4;
            shape[2] = 3;
            v.assign(shape.begin(), shape.end(), data2x_);

            test(v.dimension() == shape.size() &&
                   v.size() == 24
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(v.shape(j) == shape[j]);
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == data2x_[j]);
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    for(std::size_t p=0; p<v.shape(2); ++p) {
                        test(v(j, k, p) == data2x_[ j + k*shape[0] + p*shape[0]*shape[1] ]);
                    }
                }
            }
        }
    }
    // 1D... 
    {
        // to scalar 
        { 
            std::vector<std::size_t> shape(1), shape0(0);
            shape[0] = 24;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            v.assign(shape0.begin(), shape0.end(), data_);

            test(v.dimension() == shape0.size() &&
               v.size() == 1
            );
        }
        // to 1D
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            v.assign(shape.begin(), shape.end(), data2x_);

            test(v.dimension() == shape.size() &&
                   v.size() == 24
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(v.shape(j) == shape[j]);
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == data2x_[j]);
            }
        }
        // to 2D
        {
            std::vector<std::size_t> shape1D(1), shape2D(2);
            shape1D[0] = 24;
            shape2D[0] = 6;
            shape2D[1] = 4;
            andres::View<int, constTarget> v(shape1D.begin(), shape1D.end(), data_);
            v.assign(shape2D.begin(), shape2D.end(), data2x_);

            test(v.dimension() == shape2D.size() &&
                   v.size() == 24
            );
            for(unsigned short j=0; j<shape2D.size(); ++j) {
                test(v.shape(j) == shape2D[j]);
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == data2x_[j]);
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    test(v(j, k) == data2x_[j+k*shape2D[0]]);
                }
            }
        }
        // to 3D
        {
            std::vector<std::size_t> shape1D(1), shape3D(3);
            shape1D[0] = 24;
            shape3D[0] = 2;
            shape3D[1] = 4;
            shape3D[2] = 3;
            andres::View<int, constTarget> v(shape1D.begin(), shape1D.end(), data_);
            v.assign(shape3D.begin(), shape3D.end(), data2x_);

            test(v.dimension() == shape3D.size() &&
                   v.size() == 24
            );
            for(unsigned short j=0; j<shape3D.size(); ++j) {
                test(v.shape(j) == shape3D[j]);
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == data2x_[j]);
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    for(std::size_t p=0; p<v.shape(2); ++p) {
                        test(v(j, k, p) == data2x_[ j + k*shape3D[0] + p*shape3D[0]*shape3D[1] ]);
                    }
                }
            }
        }
    }
    // 2D... 
    {
        // to scalar
        {
            std::vector<std::size_t> shape2D(2), shape0(0);
            shape2D[0] = 6;
            shape2D[1] = 4; 
            andres::View<int, constTarget> v(shape2D.begin(), shape2D.end(), data_);
            v.assign(shape0.begin(), shape0.end(), data_);

            test(v.dimension() == shape0.size() &&
                   v.size() == 1
            );
        }
        // to 1D
        {
            std::vector<std::size_t> shape2D(2), shape1D(1);
            shape2D[0] = 6;
            shape2D[1] = 4; 
            shape1D[0] = 24;
            andres::View<int, constTarget> v(shape2D.begin(), shape2D.end(), data_);
            v.assign(shape1D.begin(), shape1D.end(), data2x_);

            test(v.dimension() == shape1D.size() &&
                   v.size() == 24
            );
            for(unsigned short j=0; j<shape1D.size(); ++j) {
                test(v.shape(j) == shape1D[j]);
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == data2x_[j]);
            }
        }
        // to 2D
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            v.assign(shape.begin(), shape.end(), data2x_);

            test(v.dimension() == shape.size() &&
                   v.size() == 24
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(v.shape(j) == shape[j]);
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    test(v(j, k) == data2x_[j+k*shape[0]]);
                }
            }
        }
        // to 2D with different shape
        {
            std::vector<std::size_t> shape(2), shapeBefore(2);
            shapeBefore[0] = 4;
            shapeBefore[1] = 6;
            shape[0] = 6;
            shape[1] = 4;
            andres::View<int, constTarget> v(shapeBefore.begin(), shapeBefore.end(), data_);
            v.assign(shape.begin(), shape.end(), data2x_);

            test(v.dimension() == shape.size() &&
                   v.size() == 24
            );
            for(unsigned short j=0; j<shape.size(); ++j) {
                test(v.shape(j) == shape[j]);
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    test(v(j, k) == data2x_[j+k*shape[0]]);
                }
            }
        }
        // to 3D
        {
            std::vector<std::size_t> shape2D(2), shape3D(3);
            shape2D[0] = 6;
            shape2D[1] = 4;
            andres::View<int, constTarget> v(shape2D.begin(), shape2D.end(), data_);
            shape3D[0] = 2;
            shape3D[1] = 4;
            shape3D[2] = 3;
            v.assign(shape3D.begin(), shape3D.end(), data_);

            test(v.dimension() == shape3D.size() &&
                   v.size() == 24
            );
            for(unsigned short j=0; j<shape3D.size(); ++j) {
                test(v.shape(j) == shape3D[j]);
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == data_[j]);
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    for(std::size_t p=0; p<v.shape(2); ++p) {
                        test(v(j, k, p) == data_[ j + k*shape3D[0] + p*shape3D[0]*shape3D[1] ]);
                    }
                }
            }
        }
    }
    // 3D...  
    {
        // to scalar
        {
            std::vector<std::size_t> shape3D(3), shape0(0);
            shape3D[0] = 3;
            shape3D[1] = 4;
            shape3D[2] = 2;
            andres::View<int, constTarget> v(shape3D.begin(), shape3D.end(), data_);
            v.assign(shape0.begin(), shape0.end(), data_);

            test(v.dimension() == shape0.size() &&
                   v.size() == 1
            );
        }
        // to 1D
        {
            std::vector<std::size_t> shape3D(3), shape1D(1);
            shape3D[0] = 3;
            shape3D[1] = 4;
            shape3D[2] = 2;
            shape1D[0] = 24; 
            andres::View<int, constTarget> v(shape3D.begin(), shape3D.end(), data_);
            v.assign(shape1D.begin(), shape1D.end(), data2x_);

            test(v.dimension() == shape1D.size() &&
                   v.size() == 24
            );
            for(unsigned short j=0; j<shape1D.size(); ++j) {
                test(v.shape(j) == shape1D[j]);
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == data2x_[j]);
            }
        }
        // to 2D
        {
            std::vector<std::size_t> shape3D(3), shape2D(2);
            shape3D[0] = 2;
            shape3D[1] = 4;
            shape3D[2] = 3;
            andres::View<int, constTarget> v(shape3D.begin(), shape3D.end(), data_);
            shape2D[0] = 6;
            shape2D[1] = 4;
            v.assign(shape2D.begin(), shape2D.end(), data_);
            
            test(v.dimension() == shape2D.size() &&
                   v.size() == 24
            );
            for(unsigned short j=0; j<shape2D.size(); ++j) {
                test(v.shape(j) == shape2D[j]);
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == data_[j]);
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    test(v(j, k) == data_[j+k*shape2D[0]]);
                }
            }
        }
        // to 3D
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 2;
            shape[1] = 4;
            shape[2] = 3;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            v.assign(shape.begin(), shape.end(), data2x_);

            for(unsigned short j=0; j<shape.size(); ++j) {
                test(v.shape(j) == shape[j]);
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == data2x_[j]);
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    for(std::size_t p=0; p<v.shape(2); ++p) {
                        test(v(j, k, p) == data2x_[ j + k*shape[0] + p*shape[0]*shape[1] ]);
                    }
                }
            }
        }
        // to 3D with different shape
        {
            std::vector<std::size_t> shape(3), shapeBefore(3);
            shapeBefore[0] = 3;
            shapeBefore[1] = 2;
            shapeBefore[2] = 4;
            shape[0] = 2;
            shape[1] = 4;
            shape[2] = 3;
            andres::View<int, constTarget> v(shapeBefore.begin(), shapeBefore.end(), data_);
            v.assign(shape.begin(), shape.end(), data2x_);

            for(unsigned short j=0; j<shape.size(); ++j) {
                test(v.shape(j) == shape[j]);
            }
            for(std::size_t j=0; j<v.size(); ++j) {
                test(v(j) == data2x_[j]);
            }
            for(std::size_t j=0; j<v.shape(0); ++j) {
                for(std::size_t k=0; k<v.shape(1); ++k) {
                    for(std::size_t p=0; p<v.shape(2); ++p) {
                        test(v(j, k, p) == data2x_[ j + k*shape[0] + p*shape[0]*shape[1] ]);
                    }
                }
            }
        }
    }
}